

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

ALLEGRO_CONFIG * al_load_config_file_f(ALLEGRO_FILE *file)

{
  _Bool _Var1;
  int iVar2;
  ALLEGRO_CONFIG *config;
  ALLEGRO_USTR *us1;
  ALLEGRO_USTR *us1_00;
  ALLEGRO_USTR *us1_01;
  ALLEGRO_USTR *us1_02;
  char *pcVar3;
  size_t sVar4;
  ALLEGRO_USTR *pAVar5;
  bool bVar6;
  ALLEGRO_CONFIG_SECTION *local_d0;
  char local_b8 [136];
  
  config = (ALLEGRO_CONFIG *)
           al_calloc_with_context
                     (1,0x18,0x27,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/config.c"
                      ,"al_create_config");
  if (config == (ALLEGRO_CONFIG *)0x0) {
    config = (ALLEGRO_CONFIG *)0x0;
  }
  else {
    us1 = al_ustr_new("");
    us1_00 = al_ustr_new("");
    us1_01 = al_ustr_new("");
    us1_02 = al_ustr_new("");
    al_ustr_assign_cstr(us1,"");
    pcVar3 = al_fgets(file,local_b8,0x80);
    bVar6 = pcVar3 == (char *)0x0;
    if (!bVar6) {
      local_d0 = (ALLEGRO_CONFIG_SECTION *)0x0;
LAB_001459d3:
      do {
        al_ustr_append_cstr(us1,local_b8);
        _Var1 = al_ustr_has_suffix_cstr(us1,"\n");
        if (!_Var1) {
          pcVar3 = al_fgets(file,local_b8,0x80);
          if (pcVar3 != (char *)0x0) goto LAB_001459d3;
        }
        if (bVar6) break;
        al_ustr_trim_ws(us1);
        _Var1 = al_ustr_has_prefix_cstr(us1,"#");
        if ((_Var1) || (sVar4 = al_ustr_size(us1), sVar4 == 0)) {
          if (local_d0 == (ALLEGRO_CONFIG_SECTION *)0x0) {
            pAVar5 = al_ustr_empty_string();
          }
          else {
            pAVar5 = local_d0->name;
          }
          config_add_comment(config,pAVar5,us1);
        }
        else {
          _Var1 = al_ustr_has_prefix_cstr(us1,"[");
          if (_Var1) {
            sVar4 = al_ustr_size(us1);
            iVar2 = al_ustr_rfind_chr(us1,(int)sVar4,0x5d);
            if (iVar2 == -1) {
              sVar4 = al_ustr_size(us1);
              iVar2 = (int)sVar4;
            }
            al_ustr_assign_substr(us1_00,us1,1,iVar2);
            local_d0 = config_add_section(config,us1_00);
          }
          else {
            iVar2 = al_ustr_find_chr(us1,0,0x3d);
            if (iVar2 == -1) {
              al_ustr_assign(us1_01,us1);
              al_ustr_assign_cstr(us1_02,"");
            }
            else {
              al_ustr_assign_substr(us1_01,us1,0,iVar2);
              sVar4 = al_ustr_size(us1);
              al_ustr_assign_substr(us1_02,us1,iVar2 + 1,(int)sVar4);
            }
            al_ustr_trim_ws(us1_01);
            al_ustr_trim_ws(us1_02);
            if (local_d0 == (ALLEGRO_CONFIG_SECTION *)0x0) {
              pAVar5 = al_ustr_empty_string();
              config_set_value(config,pAVar5,us1_01,us1_02);
              local_d0 = (ALLEGRO_CONFIG_SECTION *)0x0;
            }
            else {
              config_set_value(config,local_d0->name,us1_01,us1_02);
            }
          }
        }
        al_ustr_assign_cstr(us1,"");
        pcVar3 = al_fgets(file,local_b8,0x80);
        bVar6 = pcVar3 == (char *)0x0;
      } while (!bVar6);
    }
    al_ustr_free(us1);
    al_ustr_free(us1_00);
    al_ustr_free(us1_01);
    al_ustr_free(us1_02);
  }
  return config;
}

Assistant:

ALLEGRO_CONFIG *al_load_config_file_f(ALLEGRO_FILE *file)
{
   ALLEGRO_CONFIG *config;
   ALLEGRO_CONFIG_SECTION *current_section = NULL;
   ALLEGRO_USTR *line;
   ALLEGRO_USTR *section;
   ALLEGRO_USTR *key;
   ALLEGRO_USTR *value;
   ASSERT(file);

   config = al_create_config();
   if (!config) {
      return NULL;
   }

   line = al_ustr_new("");
   section = al_ustr_new("");
   key = al_ustr_new("");
   value = al_ustr_new("");

   while (1) {
      al_ustr_assign_cstr(line, "");
      if (!readline(file, line))
         break;
      al_ustr_trim_ws(line);

      if (al_ustr_has_prefix_cstr(line, "#") || al_ustr_size(line) == 0) {
         /* Preserve comments and blank lines */
         const ALLEGRO_USTR *name;
         if (current_section)
            name = current_section->name;
         else
            name = al_ustr_empty_string();
         config_add_comment(config, name, line);
      }
      else if (al_ustr_has_prefix_cstr(line, "[")) {
         int rbracket = al_ustr_rfind_chr(line, al_ustr_size(line), ']');
         if (rbracket == -1)
            rbracket = al_ustr_size(line);
         al_ustr_assign_substr(section, line, 1, rbracket);
         current_section = config_add_section(config, section);
      }
      else {
         get_key_and_value(line, key, value);
         if (current_section == NULL)
            config_set_value(config, al_ustr_empty_string(), key, value);
         else
            config_set_value(config, current_section->name, key, value);
      }
   }

   al_ustr_free(line);
   al_ustr_free(section);
   al_ustr_free(key);
   al_ustr_free(value);

   return config;
}